

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

ravi_type_map declare_localvar(LexState *ls,TString **pusertype)

{
  int iVar1;
  TString *name_00;
  TString *pTVar2;
  TString *__s1;
  bool bVar3;
  char *str;
  TString *typename;
  ravi_type_map tm;
  TString *name;
  TString **pusertype_local;
  LexState *ls_local;
  
  name_00 = str_checkname(ls);
  typename._4_4_ = 0xffffffff;
  iVar1 = testnext(ls,0x3a);
  if (iVar1 != 0) {
    pTVar2 = str_checkname(ls);
    __s1 = pTVar2 + 1;
    iVar1 = strcmp((char *)__s1,"integer");
    if (iVar1 == 0) {
      typename._4_4_ = 8;
    }
    else {
      iVar1 = strcmp((char *)__s1,"number");
      if (iVar1 == 0) {
        typename._4_4_ = 0x10;
      }
      else {
        iVar1 = strcmp((char *)__s1,"closure");
        if (iVar1 == 0) {
          typename._4_4_ = 0x201;
        }
        else {
          iVar1 = strcmp((char *)__s1,"table");
          if (iVar1 == 0) {
            typename._4_4_ = 0x80;
          }
          else {
            iVar1 = strcmp((char *)__s1,"string");
            if (iVar1 == 0) {
              typename._4_4_ = 0x101;
            }
            else {
              iVar1 = strcmp((char *)__s1,"any");
              if (iVar1 == 0) {
                typename._4_4_ = 0xffffffff;
              }
              else {
                typename._4_4_ = 0x401;
                pTVar2 = user_defined_type_name(ls,pTVar2);
                *pusertype = pTVar2;
              }
            }
          }
        }
      }
    }
    if (((typename._4_4_ == 0x10) || (typename._4_4_ == 8)) &&
       (iVar1 = testnext(ls,0x5b), iVar1 != 0)) {
      checknext(ls,0x5d);
      bVar3 = typename._4_4_ == 0x10;
      typename._4_4_ = 0x20;
      if (bVar3) {
        typename._4_4_ = 0x40;
      }
    }
  }
  new_localvar(ls,name_00,typename._4_4_,*pusertype);
  return typename._4_4_;
}

Assistant:

static ravi_type_map declare_localvar(LexState *ls, TString **pusertype) {
  /* RAVI change - add type */
  TString *name = str_checkname(ls);
  /* assume a dynamic type */
  ravi_type_map tm = RAVI_TM_ANY;
  /* if the variable name is followed by a colon then we have a type
   * specifier
   */

  if (testnext(ls, ':')) {
    TString *typename = str_checkname(ls); /* we expect a type name */
    const char *str = getstr(typename);
    /* following is not very nice but easy as
     * the lexer doesn't need to be changed
     */
    if (strcmp(str, "integer") == 0)
      tm = RAVI_TM_INTEGER;
    else if (strcmp(str, "number") == 0)
      tm = RAVI_TM_FLOAT;
    else if (strcmp(str, "closure") == 0)
      tm = RAVI_TM_FUNCTION_OR_NIL;
    else if (strcmp(str, "table") == 0)
      tm = RAVI_TM_TABLE;
    else if (strcmp(str, "string") == 0)
      tm = RAVI_TM_STRING_OR_NIL;
    //else if (strcmp(str, "boolean") == 0)
    //  tm = RAVI_TM_BOOLEAN_OR_NIL;
    else if (strcmp(str, "any") == 0)
      tm = RAVI_TM_ANY;
    else {
      /* default is a userdata type */
      tm = RAVI_TM_USERDATA_OR_NIL;
      typename = user_defined_type_name(ls, typename);
      str = getstr(typename);
      *pusertype = typename;
    }
    if (tm == RAVI_TM_FLOAT || tm == RAVI_TM_INTEGER) {
      /* if we see [] then it is an array type */
      if (testnext(ls, '[')) {
        checknext(ls, ']');
        tm = (tm == RAVI_TM_FLOAT) ? RAVI_TM_FLOAT_ARRAY : RAVI_TM_INTEGER_ARRAY;
      }
    }
  }
  new_localvar(ls, name, tm, *pusertype);
  return tm;
}